

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall
FMultiBlockThingsIterator::FMultiBlockThingsIterator
          (FMultiBlockThingsIterator *this,FPortalGroupArray *check,double checkx,double checky,
          double checkz,double checkh,double checkradius,bool ignorerestricted,sector_t *newsec)

{
  short sVar1;
  subsector_t *psVar2;
  
  this->checklist = check;
  FBlockThingsIterator::FBlockThingsIterator(&this->blockIterator);
  (this->bbox).m_Box[3] = -3.4028234663852886e+38;
  (this->bbox).m_Box[0] = -3.4028234663852886e+38;
  (this->bbox).m_Box[2] = 3.4028234663852886e+38;
  (this->bbox).m_Box[1] = 3.4028234663852886e+38;
  (this->checkpoint).X = checkx;
  (this->checkpoint).Y = checky;
  (this->checkpoint).Z = checkz;
  if (newsec == (sector_t *)0x0) {
    psVar2 = P_PointInSubsector(checkx,checky);
    newsec = psVar2->sector;
  }
  sVar1 = (short)newsec->PortalGroup;
  this->basegroup = sVar1;
  if (check->inited == false) {
    P_CollectConnectedGroups
              ((int)sVar1,&this->checkpoint,checkz + checkh,checkradius,this->checklist);
  }
  (this->checkpoint).Z = checkradius;
  this->portalflags = 0;
  this->index = -1;
  startIteratorForGroup(this,(int)this->basegroup);
  return;
}

Assistant:

FMultiBlockThingsIterator::FMultiBlockThingsIterator(FPortalGroupArray &check, double checkx, double checky, double checkz, double checkh, double checkradius, bool ignorerestricted, sector_t *newsec)
	: checklist(check)
{
	checkpoint.X = checkx;
	checkpoint.Y = checky;
	checkpoint.Z = checkz;
	if (newsec == NULL) newsec = P_PointInSector(checkx, checky);
	basegroup = newsec->PortalGroup;
	if (!check.inited) P_CollectConnectedGroups(basegroup, checkpoint, checkz + checkh, checkradius, checklist);
	checkpoint.Z = checkradius;
	Reset();
}